

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_contains_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  uint8_t typecode;
  int32_t pos;
  uint uVar4;
  uint uVar5;
  void *c;
  
  uVar4 = val >> 0x10;
  c = context->container;
  pos = -1;
  if (c != (void *)0x0) {
    if (uVar4 == context->key) {
      typecode = context->typecode;
      goto LAB_00101b5b;
    }
    if (context->key < uVar4) {
      pos = context->idx;
    }
  }
  uVar3 = ra_advance_until(&r->high_low_container,(uint16_t)(val >> 0x10),pos);
  if (uVar3 != (r->high_low_container).size) {
    uVar5 = uVar3 & 0xffff;
    typecode = (r->high_low_container).typecodes[uVar5];
    c = (r->high_low_container).containers[uVar5];
    context->container = c;
    context->typecode = typecode;
    context->idx = uVar3;
    uVar1 = (r->high_low_container).keys[uVar5];
    context->key = uVar1;
    if (uVar4 == uVar1) {
LAB_00101b5b:
      _Var2 = container_contains(c,(uint16_t)val,typecode);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_bulk(const roaring_bitmap_t *r,
                                  roaring_bulk_context_t *context,
                                  uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        int32_t start_idx = -1;
        if (context->container != NULL && context->key < key) {
            start_idx = context->idx;
        }
        int idx = ra_advance_until(&r->high_low_container, key, start_idx);
        if (idx == ra_get_size(&r->high_low_container)) {
            return false;
        }
        uint8_t typecode;
        context->container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)idx, &typecode);
        context->typecode = typecode;
        context->idx = idx;
        context->key =
            ra_get_key_at_index(&r->high_low_container, (uint16_t)idx);
        // ra_advance_until finds the next key >= the target, we found a later
        // container.
        if (context->key != key) {
            return false;
        }
    }
    // context is now set up
    return container_contains(context->container, val & 0xFFFF,
                              context->typecode);
}